

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall crypto_tests::CryptoTest::TestRIPEMD160(CryptoTest *this,string *in,string *hexout)

{
  long in_FS_OFFSET;
  string_view hex_str;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  CRIPEMD160 local_88;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CRIPEMD160::CRIPEMD160(&local_88);
  hex_str._M_str = (hexout->_M_dataplus)._M_p;
  hex_str._M_len = hexout->_M_string_length;
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0,hex_str);
  TestVector<CRIPEMD160,std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (this,&local_88,in,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestRIPEMD160(const std::string &in, const std::string &hexout) { TestVector(CRIPEMD160(), in, ParseHex(hexout));}